

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

obj_use_status object_selection_checks(obj *otmp,char *word)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  int otyp;
  long dummymask;
  char *word_local;
  obj *otmp_local;
  
  iVar2 = (int)otmp->otyp;
  dummymask = (long)word;
  word_local = (char *)otmp;
  bVar1 = taking_off(word);
  if ((((bVar1 != '\0') && ((*(uint *)(word_local + 0x60) & 0xf007f) == 0)) ||
      ((bVar1 = putting_on((char *)dummymask), bVar1 != '\0' &&
       ((*(uint *)(word_local + 0x60) & 0xf007f) != 0)))) ||
     ((iVar3 = strcmp((char *)dummymask,"ready"), iVar3 == 0 &&
      (((obj *)word_local == uwep || (((obj *)word_local == uswapwep && (u.twoweap != '\0')))))))) {
    return ALREADY_IN_USE;
  }
  bVar1 = taking_off((char *)dummymask);
  if ((bVar1 != '\0') &&
     ((((obj *)word_local == uarm && (uarmc != (obj *)0x0)) ||
      (((obj *)word_local == uarmu && ((uarm != (obj *)0x0 || (uarmc != (obj *)0x0)))))))) {
    return ARMOR_TAKEOFF_BLOCKED;
  }
  bVar1 = putting_on((char *)dummymask);
  if (((((((bVar1 == '\0') ||
          (((word_local[0x35] != '\a' || (*(short *)(word_local + 0x2a) == 0x113)) &&
           ((word_local[0x35] != '\x06' || (((iVar2 == 0xee || (iVar2 == 0xef)) || (iVar2 == 0xed)))
            ))))) &&
         (((iVar3 = strcmp((char *)dummymask,"wield"), iVar3 != 0 || (word_local[0x35] != '\x06'))
          || ((word_local[0x35] == '\x06' &&
              (objects[*(short *)(word_local + 0x2a)].oc_subtyp != '\0')))))) &&
        (((((iVar3 = strcmp((char *)dummymask,"eat"), iVar3 != 0 ||
            (bVar1 = is_edible((obj *)word_local), bVar1 != '\0')) &&
           ((iVar3 = strcmp((char *)dummymask,"sacrifice"), iVar3 != 0 ||
            (((iVar2 == 0x10e || (iVar2 == 0xd9)) || (iVar2 == 0xd8)))))) &&
          (((iVar3 = strcmp((char *)dummymask,"write with"), iVar3 != 0 ||
            (word_local[0x35] != '\x06')) || ((iVar2 == 0xf7 || (iVar2 == 0xef)))))) &&
         ((iVar3 = strcmp((char *)dummymask,"tin"), iVar3 != 0 ||
          ((iVar2 == 0x10e && (bVar1 = tinnable((obj *)word_local), bVar1 != '\0')))))))) &&
       (((iVar3 = strcmp((char *)dummymask,"rub"), iVar3 != 0 ||
         (((((word_local[0x35] != '\x06' || (iVar2 == 0xe8)) || (iVar2 == 0xe9)) || (iVar2 == 0xe7))
          && (((word_local[0x35] != '\r' || (*(short *)(word_local + 0x2a) == 0x20f)) ||
              ((*(short *)(word_local + 0x2a) == 0x210 ||
               ((*(short *)(word_local + 0x2a) == 0x212 || (*(short *)(word_local + 0x2a) == 0x211))
               )))))))) &&
        (((iVar3 = strncmp((char *)dummymask,"rub on the stone",0x10), iVar3 != 0 ||
          (((word_local[0x35] != '\r' || ((*(uint *)(word_local + 0x4a) >> 5 & 1) == 0)) ||
           ((objects[iVar2].field_0x10 & 1) == 0)))) &&
         ((iVar3 = strcmp((char *)dummymask,"tip"), iVar3 != 0 ||
          ((0xd9 < *(short *)(word_local + 0x2a) && (*(short *)(word_local + 0x2a) < 0xe2))))))))))
      && ((((iVar3 = strcmp((char *)dummymask,"use or apply"), iVar3 != 0 &&
            (iVar3 = strcmp((char *)dummymask,"untrap with"), iVar3 != 0)) ||
           ((((word_local[0x35] != '\x02' ||
              (((word_local[0x35] == '\x02' || (word_local[0x35] == '\x06')) &&
               (objects[*(short *)(word_local + 0x2a)].oc_subtyp == '\x04')))) ||
             (((((word_local[0x35] == '\x02' || (word_local[0x35] == '\x06')) &&
                (objects[*(short *)(word_local + 0x2a)].oc_subtyp == '\x03')) ||
               (((word_local[0x35] == '\x02' || (word_local[0x35] == '\x06')) &&
                ((objects[*(short *)(word_local + 0x2a)].oc_subtyp == '\x11' ||
                 (objects[*(short *)(word_local + 0x2a)].oc_subtyp == '\x15')))))) ||
              (iVar2 == 0x41)))) &&
            ((word_local[0x35] != '\f' &&
             (((word_local[0x35] != '\b' ||
               (((iVar2 == 0x142 && ((*(uint *)(word_local + 0x4a) >> 5 & 1) != 0)) &&
                ((objects[0x142].field_0x10 & 1) != 0)))) &&
              ((((word_local[0x35] != '\a' || (iVar2 == 0x120)) || (iVar2 == 0x115)) &&
               (((word_local[0x35] != '\r' || (*(short *)(word_local + 0x2a) == 0x20f)) ||
                ((*(short *)(word_local + 0x2a) == 0x210 ||
                 ((*(short *)(word_local + 0x2a) == 0x212 ||
                  (*(short *)(word_local + 0x2a) == 0x211)))))))))))))))) &&
          ((((iVar3 = strncmp((char *)dummymask,"invoke",6), iVar3 != 0 ||
             ((((word_local[0x37] != '\0' || (((byte)objects[iVar2].field_0x10 >> 6 & 1) != 0)) ||
               (iVar2 == 0xd8)) || (word_local[0x35] == '\v')))) ||
            (((((word_local[0x35] != '\x06' || (iVar2 == 0xe8)) ||
               ((iVar2 == 0xe9 || (iVar2 == 0xe7)))) &&
              (((((word_local[0x35] != '\r' || (*(short *)(word_local + 0x2a) == 0x20f)) ||
                 (*(short *)(word_local + 0x2a) == 0x210)) ||
                ((*(short *)(word_local + 0x2a) == 0x212 || (*(short *)(word_local + 0x2a) == 0x211)
                 ))) && ((word_local[0x35] == '\x06' || (word_local[0x35] == '\r')))))) ||
             (((iVar2 == 0xec || (iVar2 == 0xeb)) || (iVar2 == 0xe9)))))) ||
           ((iVar2 == 0xe8 &&
            (((*(uint *)(word_local + 0x4a) >> 5 & 1) == 0 || ((objects[0xe8].field_0x10 & 1) == 0))
            )))))))) &&
     ((((iVar3 = strcmp((char *)dummymask,"untrap with"), iVar3 != 0 ||
        ((word_local[0x35] != '\x06' || (iVar2 == 0xf5)))) &&
       ((iVar2 = strcmp((char *)dummymask,"charge"), iVar2 != 0 ||
        (bVar1 = is_chargeable((obj *)word_local), bVar1 != '\0')))) &&
      (((word_local[0x35] != '\f' || (iVar2 = strcmp((char *)dummymask,"eat"), iVar2 != 0)) ||
       ((((youmonst.data)->mflags1 & 0x80000000) != 0 && (youmonst.data != mons + 0xd9)))))))) {
    bVar1 = putting_on((char *)dummymask);
    if (((bVar1 != '\0') && (word_local[0x35] == '\x03')) &&
       (iVar2 = canwearobj((obj *)word_local,(long *)&stack0xffffffffffffffd8,'\0'), iVar2 == 0)) {
      return CURRENTLY_NOT_USABLE;
    }
    return OBJECT_USABLE;
  }
  return UNSUITABLE_USE;
}

Assistant:

static enum obj_use_status object_selection_checks(struct obj *otmp,
						   const char *word)
{
	long dummymask;
	int otyp = otmp->otyp;
	
	/* ugly check: remove inappropriate things */
	if ((taking_off(word) &&
	    !(otmp->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL)))
	|| (putting_on(word) &&
		(otmp->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL))) /* already worn */
	|| (!strcmp(word, "ready") &&
	    (otmp == uwep || (otmp == uswapwep && u.twoweap))))
	    return ALREADY_IN_USE;

	if (taking_off(word) &&
	    ((otmp == uarm && uarmc) || (otmp == uarmu && (uarm || uarmc))))
	    return ARMOR_TAKEOFF_BLOCKED;

	/* Second ugly check; unlike the first it won't trigger an
	 * "else" in "you don't have anything else to ___".
	 */
	else if ((putting_on(word) &&
	    ((otmp->oclass == FOOD_CLASS && otmp->otyp != MEAT_RING) ||
	    (otmp->oclass == TOOL_CLASS &&
		otyp != BLINDFOLD && otyp != TOWEL && otyp != LENSES)))
	    || (!strcmp(word, "wield") &&
		(otmp->oclass == TOOL_CLASS && !is_weptool(otmp)))
	    || (!strcmp(word, "eat") && !is_edible(otmp))
	    || (!strcmp(word, "sacrifice") &&
		(otyp != CORPSE &&
		    otyp != AMULET_OF_YENDOR && otyp != FAKE_AMULET_OF_YENDOR))
	    || (!strcmp(word, "write with") &&
		(otmp->oclass == TOOL_CLASS &&
		    otyp != MAGIC_MARKER && otyp != TOWEL))
	    || (!strcmp(word, "tin") &&
		(otyp != CORPSE || !tinnable(otmp)))
	    || (!strcmp(word, "rub") &&
		((otmp->oclass == TOOL_CLASS &&
		    otyp != OIL_LAMP && otyp != MAGIC_LAMP &&
		    otyp != BRASS_LANTERN) ||
		    (otmp->oclass == GEM_CLASS && !is_graystone(otmp))))
	    || (!strncmp(word, "rub on the stone", 16) &&
		otmp->oclass == GEM_CLASS &&	/* using known touchstone */
		otmp->dknown && objects[otyp].oc_name_known)
	    || (!strcmp(word, "tip") &&
		!Is_container(otmp))
	    || ((!strcmp(word, "use or apply") ||
		    !strcmp(word, "untrap with")) &&
		    /* Picks, axes, pole-weapons, bullwhips */
		((otmp->oclass == WEAPON_CLASS && !is_pick(otmp) &&
		    !is_axe(otmp) && !is_pole(otmp) && otyp != BULLWHIP) ||
		    otmp->oclass == COIN_CLASS ||
		    (otmp->oclass == POTION_CLASS &&
		    /* only applicable potion is oil, and it will only
		    be offered as a choice when already discovered */
		    (otyp != POT_OIL || !otmp->dknown ||
		     !objects[POT_OIL].oc_name_known)) ||
		    (otmp->oclass == FOOD_CLASS &&
		     otyp != CREAM_PIE && otyp != EUCALYPTUS_LEAF) ||
		    (otmp->oclass == GEM_CLASS && !is_graystone(otmp))))
                 || (!strncmp(word, "invoke", 6) &&
		(!otmp->oartifact && !objects[otyp].oc_unique &&
		     otyp != FAKE_AMULET_OF_YENDOR &&
                     otmp->oclass != WAND_CLASS && /* V for breaking wands */
                     ((otmp->oclass == TOOL_CLASS && /* V for rubbing */
                       otyp != OIL_LAMP && otyp != MAGIC_LAMP &&
                       otyp != BRASS_LANTERN) ||
                      (otmp->oclass == GEM_CLASS && !is_graystone(otmp)) ||
                      (otmp->oclass != TOOL_CLASS && otmp->oclass != GEM_CLASS)) &&
		     otyp != CRYSTAL_BALL &&	/* V for applying */
		/* note: presenting the possibility of invoking non-artifact
		    mirrors and/or lamps is a simply a cruel deception... */
		     otyp != MIRROR && otyp != MAGIC_LAMP &&
		    (otyp != OIL_LAMP ||	/* don't list known oil lamp */
		    (otmp->dknown && objects[OIL_LAMP].oc_name_known))))
	    || (!strcmp(word, "untrap with") &&
		(otmp->oclass == TOOL_CLASS && otyp != CAN_OF_GREASE))
	    || (!strcmp(word, "charge") && !is_chargeable(otmp))
	    || (otmp->oclass == COIN_CLASS && !strcmp(word, "eat") &&
		(!metallivorous(youmonst.data) || youmonst.data == &mons[PM_RUST_MONSTER])))
	    return UNSUITABLE_USE;
		
	/* ugly check for unworn armor that can't be worn */
	else if (putting_on(word) && otmp->oclass == ARMOR_CLASS &&
		    !canwearobj(otmp, &dummymask, FALSE))
	    return CURRENTLY_NOT_USABLE;
	
	return OBJECT_USABLE;
}